

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O2

void __thiscall
CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
          (cache<uint256,_SignatureCacheHasher> *this,uint256 e)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  __atomic_base<unsigned_char> *p_Var1;
  uchar *puVar2;
  uint uVar3;
  pointer puVar4;
  bool bVar5;
  uint *puVar6;
  ulong *puVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  long in_FS_OFFSET;
  reference rVar12;
  reference rVar13;
  uint32_t last_loc;
  array<unsigned_int,_8UL> locs;
  array<unsigned_int,_8UL> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  epoch_check(this);
  last_loc = 0xffffffff;
  compute_hashes(&locs,this,(uint256 *)&e.super_base_blob<256U>);
  lVar11 = 0;
  do {
    if (lVar11 == 0x20) {
      this_00 = &this->epoch_flags;
      bVar9 = 0;
      bVar5 = true;
      while( true ) {
        if (this->depth_limit <= bVar9) break;
        lVar11 = 0;
        while (lVar11 != 0x20) {
          uVar3 = *(uint *)((long)locs._M_elems + lVar11);
          uVar10 = (ulong)uVar3;
          lVar11 = lVar11 + 4;
          if (((this->collection_flags).mem._M_t.
               super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
               .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl[uVar3 >> 3].
               super___atomic_base<unsigned_char>._M_i >> (uVar3 & 7) & 1) != 0) {
            puVar4 = (this->table).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar2 = (uchar *)((long)&puVar4[uVar10].super_base_blob<256U>.m_data + 0x10);
            *(undefined8 *)puVar2 = e.super_base_blob<256U>.m_data._M_elems._16_8_;
            *(undefined8 *)(puVar2 + 8) = e.super_base_blob<256U>.m_data._M_elems._24_8_;
            puVar4 = puVar4 + uVar10;
            *(undefined8 *)&(puVar4->super_base_blob<256U>).m_data =
                 e.super_base_blob<256U>.m_data._M_elems._0_8_;
            *(undefined8 *)((long)&(puVar4->super_base_blob<256U>).m_data + 8) =
                 e.super_base_blob<256U>.m_data._M_elems._8_8_;
            LOCK();
            p_Var1 = &(this->collection_flags).mem._M_t.
                      super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                      .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl
                      [uVar3 >> 3].super___atomic_base<unsigned_char>;
            p_Var1->_M_i = p_Var1->_M_i & ~(byte)(1 << ((byte)uVar3 & 7));
            UNLOCK();
            rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar10);
            if (bVar5) goto LAB_002e6bfc;
            *rVar12._M_p = *rVar12._M_p & ~rVar12._M_mask;
            goto LAB_002e6c07;
          }
        }
        puVar6 = std::
                 __find_if<unsigned_int*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                           (&locs,&local_58,&last_loc);
        last_loc = locs._M_elems[((uint)((int)puVar6 - (int)&locs) >> 2) + 1 & 7];
        uVar10 = (ulong)last_loc;
        puVar4 = (this->table).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_58._M_elems._0_8_ = *(undefined8 *)&puVar4[uVar10].super_base_blob<256U>.m_data;
        local_58._M_elems._8_8_ =
             *(undefined8 *)((long)&puVar4[uVar10].super_base_blob<256U>.m_data + 8);
        puVar2 = (uchar *)((long)&puVar4[uVar10].super_base_blob<256U>.m_data + 0x10);
        local_58._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_58._M_elems._24_8_ = *(undefined8 *)(puVar2 + 8);
        puVar2 = (uchar *)((long)&puVar4[uVar10].super_base_blob<256U>.m_data + 0x10);
        *(undefined8 *)puVar2 = e.super_base_blob<256U>.m_data._M_elems._16_8_;
        *(undefined8 *)(puVar2 + 8) = e.super_base_blob<256U>.m_data._M_elems._24_8_;
        *(undefined8 *)&puVar4[uVar10].super_base_blob<256U>.m_data =
             e.super_base_blob<256U>.m_data._M_elems._0_8_;
        *(undefined8 *)((long)&puVar4[uVar10].super_base_blob<256U>.m_data + 8) =
             e.super_base_blob<256U>.m_data._M_elems._8_8_;
        e.super_base_blob<256U>.m_data._M_elems._0_8_ = local_58._M_elems._0_8_;
        e.super_base_blob<256U>.m_data._M_elems._8_8_ = local_58._M_elems._8_8_;
        e.super_base_blob<256U>.m_data._M_elems._16_8_ = local_58._M_elems._16_8_;
        e.super_base_blob<256U>.m_data._M_elems._24_8_ = local_58._M_elems._24_8_;
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar10);
        uVar10 = *rVar12._M_p;
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)last_loc);
        puVar7 = rVar13._M_p;
        if (bVar5) {
          uVar8 = rVar13._M_mask | *puVar7;
        }
        else {
          uVar8 = ~rVar13._M_mask & *puVar7;
        }
        *puVar7 = uVar8;
        compute_hashes(&local_58,this,(uint256 *)&e.super_base_blob<256U>);
        locs._M_elems[4] = local_58._M_elems[4];
        locs._M_elems[5] = local_58._M_elems[5];
        locs._M_elems[6] = local_58._M_elems[6];
        locs._M_elems[7] = local_58._M_elems[7];
        locs._M_elems[0] = local_58._M_elems[0];
        locs._M_elems[1] = local_58._M_elems[1];
        locs._M_elems[2] = local_58._M_elems[2];
        locs._M_elems[3] = local_58._M_elems[3];
        bVar9 = bVar9 + 1;
        bVar5 = (uVar10 & rVar12._M_mask) != 0;
      }
      goto LAB_002e6c07;
    }
    uVar3 = *(uint *)((long)locs._M_elems + lVar11);
    bVar5 = ::operator==(&(this->table).super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar3].super_base_blob<256U>,
                         &e.super_base_blob<256U>);
    lVar11 = lVar11 + 4;
  } while (!bVar5);
  LOCK();
  p_Var1 = &(this->collection_flags).mem._M_t.
            super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
            .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl[uVar3 >> 3].
            super___atomic_base<unsigned_char>;
  p_Var1->_M_i = p_Var1->_M_i & ~(byte)(1 << ((byte)uVar3 & 7));
  UNLOCK();
  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->epoch_flags,(ulong)uVar3);
LAB_002e6bfc:
  *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
LAB_002e6c07:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void insert(Element e)
    {
        epoch_check();
        uint32_t last_loc = invalid();
        bool last_epoch = true;
        std::array<uint32_t, 8> locs = compute_hashes(e);
        // Make sure we have not already inserted this element
        // If we have, make sure that it does not get deleted
        for (const uint32_t loc : locs)
            if (table[loc] == e) {
                please_keep(loc);
                epoch_flags[loc] = last_epoch;
                return;
            }
        for (uint8_t depth = 0; depth < depth_limit; ++depth) {
            // First try to insert to an empty slot, if one exists
            for (const uint32_t loc : locs) {
                if (!collection_flags.bit_is_set(loc))
                    continue;
                table[loc] = std::move(e);
                please_keep(loc);
                epoch_flags[loc] = last_epoch;
                return;
            }
            /** Swap with the element at the location that was
            * not the last one looked at. Example:
            *
            * 1. On first iteration, last_loc == invalid(), find returns last, so
            *    last_loc defaults to locs[0].
            * 2. On further iterations, where last_loc == locs[k], last_loc will
            *    go to locs[k+1 % 8], i.e., next of the 8 indices wrapping around
            *    to 0 if needed.
            *
            * This prevents moving the element we just put in.
            *
            * The swap is not a move -- we must switch onto the evicted element
            * for the next iteration.
            */
            last_loc = locs[(1 + (std::find(locs.begin(), locs.end(), last_loc) - locs.begin())) & 7];
            std::swap(table[last_loc], e);
            // Can't std::swap a std::vector<bool>::reference and a bool&.
            bool epoch = last_epoch;
            last_epoch = epoch_flags[last_loc];
            epoch_flags[last_loc] = epoch;

            // Recompute the locs -- unfortunately happens one too many times!
            locs = compute_hashes(e);
        }
    }